

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_subpixel_8t_intrin_ssse3.c
# Opt level: O0

void filter_horiz_w4_ssse3(uint8_t *src,ptrdiff_t src_stride,uint8_t *dst,int16_t *filter)

{
  short sVar1;
  undefined4 uVar2;
  undefined6 uVar3;
  undefined4 *in_RDX;
  ptrdiff_t in_RSI;
  uint8_t *in_RDI;
  char extraout_XMM0_Ba;
  undefined1 extraout_XMM0_Bb;
  char extraout_XMM0_Bc;
  undefined1 extraout_XMM0_Bd;
  char extraout_XMM0_Be;
  undefined1 extraout_XMM0_Bf;
  char extraout_XMM0_Bg;
  undefined1 extraout_XMM0_Bh;
  __m128i temp;
  __m128i s [4];
  longlong local_a8 [4];
  int16_t *in_stack_ffffffffffffff78;
  __m128i *in_stack_ffffffffffffff80;
  short sStack_36;
  short sStack_34;
  short sStack_32;
  
  load_8bit_8x4(in_RDI,in_RSI,(__m128i *)local_a8);
  transpose_16bit_4x4((__m128i *)local_a8,(__m128i *)local_a8);
  shuffle_filter_convolve8_8_ssse3(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  sVar1 = CONCAT11(extraout_XMM0_Bb,extraout_XMM0_Ba);
  uVar2 = CONCAT13(extraout_XMM0_Bd,CONCAT12(extraout_XMM0_Bc,sVar1));
  uVar3 = CONCAT15(extraout_XMM0_Bf,CONCAT14(extraout_XMM0_Be,uVar2));
  sStack_36 = (short)((uint)uVar2 >> 0x10);
  sStack_34 = (short)((uint6)uVar3 >> 0x20);
  sStack_32 = (short)(CONCAT17(extraout_XMM0_Bh,CONCAT16(extraout_XMM0_Bg,uVar3)) >> 0x30);
  *in_RDX = CONCAT13((0 < sStack_32) * (sStack_32 < 0x100) * extraout_XMM0_Bg - (0xff < sStack_32),
                     CONCAT12((0 < sStack_34) * (sStack_34 < 0x100) * extraout_XMM0_Be -
                              (0xff < sStack_34),
                              CONCAT11((0 < sStack_36) * (sStack_36 < 0x100) * extraout_XMM0_Bc -
                                       (0xff < sStack_36),
                                       (0 < sVar1) * (sVar1 < 0x100) * extraout_XMM0_Ba -
                                       (0xff < sVar1))));
  return;
}

Assistant:

static void filter_horiz_w4_ssse3(const uint8_t *const src,
                                  const ptrdiff_t src_stride,
                                  uint8_t *const dst,
                                  const int16_t *const filter) {
  __m128i s[4];
  __m128i temp;

  load_8bit_8x4(src, src_stride, s);
  transpose_16bit_4x4(s, s);

  temp = shuffle_filter_convolve8_8_ssse3(s, filter);
  // shrink to 8 bit each 16 bits
  temp = _mm_packus_epi16(temp, temp);
  // save only 4 bytes
  *(int *)dst = _mm_cvtsi128_si32(temp);
}